

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_dynamic.cpp
# Opt level: O0

BinCompat * __thiscall ritobin::io::BinCompat::get(BinCompat *this,string_view name)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar1;
  char *__str;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_60;
  BinCompat *(*local_50) [2];
  char *local_48;
  BinCompat *local_40;
  BinCompat *version;
  BinCompat **__end2;
  BinCompat **__begin2;
  BinCompat *(*__range2) [2];
  string_view name_local;
  
  name_local._M_len = name._M_len;
  __begin2 = (BinCompat **)&compat_impl::bin_versions;
  __end2 = (BinCompat **)&compat_impl::bin_versions;
  version = (BinCompat *)dynamic_format_impl::formats;
  __range2 = (BinCompat *(*) [2])this;
  while( true ) {
    if ((BinCompat *)__end2 == version) {
      return (BinCompat *)0x0;
    }
    local_40 = *__end2;
    local_50 = __range2;
    local_48 = (char *)name_local._M_len;
    __str = (char *)(*(code *)**(undefined8 **)local_40)();
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_60,__str);
    __x._M_str = local_48;
    __x._M_len = (size_t)local_50;
    bVar1 = std::operator==(__x,local_60);
    if (bVar1) break;
    __end2 = __end2 + 1;
  }
  return local_40;
}

Assistant:

BinCompat const* BinCompat::get(std::string_view name) noexcept {
        for (auto version: bin_versions) {
            if (version->name() == name) {
                return version;
            }
        }
        return nullptr;
    }